

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall icu_63::PluralRuleParser::getNextToken(PluralRuleParser *this,UErrorCode *status)

{
  char16_t cVar1;
  short sVar2;
  tokenType tVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  UnicodeString *pUVar7;
  int32_t offset;
  UnicodeString local_60;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  offset = this->ruleIndex;
  while( true ) {
    pUVar7 = this->ruleSrc;
    sVar2 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
    iVar5 = (int)sVar2 >> 5;
    iVar4 = (pUVar7->fUnion).fFields.fLength;
    iVar6 = iVar5;
    if (sVar2 < 0) {
      iVar6 = iVar4;
    }
    if (iVar6 <= offset) goto LAB_002ab6c8;
    cVar1 = icu_63::UnicodeString::doCharAt(pUVar7,offset);
    tVar3 = charType(cVar1);
    this->type = tVar3;
    offset = this->ruleIndex;
    if (tVar3 != tSpace) break;
    offset = offset + 1;
    this->ruleIndex = offset;
  }
  pUVar7 = this->ruleSrc;
  sVar2 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
  iVar4 = (pUVar7->fUnion).fFields.fLength;
  iVar5 = (int)sVar2 >> 5;
LAB_002ab6c8:
  if (sVar2 < 0) {
    iVar5 = iVar4;
  }
  if (offset < iVar5) {
    tVar3 = this->type;
    switch(tVar3) {
    case tNumber:
      while (tVar3 == tNumber) {
        pUVar7 = this->ruleSrc;
        sVar2 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar4 = (pUVar7->fUnion).fFields.fLength;
        }
        else {
          iVar4 = (int)sVar2 >> 5;
        }
        offset = offset + 1;
        if (iVar4 <= offset) break;
        cVar1 = icu_63::UnicodeString::doCharAt(pUVar7,offset);
        tVar3 = charType(cVar1);
        this->type = tVar3;
      }
      this->type = tNumber;
      iVar6 = offset;
      break;
    default:
      *status = U_FMT_PARSE_ERROR_START;
    case tComma:
    case tSemiColon:
    case tColon:
    case tAt:
    case tEllipsis:
    case tMod:
    case tEqual:
    case tTilde:
      iVar6 = offset + 1;
      break;
    case tDot:
      iVar6 = offset + 1;
      if ((iVar6 < iVar5) && (cVar1 = icu_63::UnicodeString::doCharAt(pUVar7,iVar6), cVar1 == L'.'))
      {
        iVar6 = offset + 2;
        pUVar7 = this->ruleSrc;
        sVar2 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar4 = (pUVar7->fUnion).fFields.fLength;
        }
        else {
          iVar4 = (int)sVar2 >> 5;
        }
        if ((iVar6 < iVar4) &&
           (cVar1 = icu_63::UnicodeString::doCharAt(pUVar7,iVar6), cVar1 == L'.')) {
          this->type = tEllipsis;
          iVar6 = offset + 3;
        }
        else {
          this->type = tDot2;
        }
      }
      break;
    case tKeyword:
      while (tVar3 == tKeyword) {
        pUVar7 = this->ruleSrc;
        sVar2 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar4 = (pUVar7->fUnion).fFields.fLength;
        }
        else {
          iVar4 = (int)sVar2 >> 5;
        }
        offset = offset + 1;
        if (iVar4 <= offset) break;
        cVar1 = icu_63::UnicodeString::doCharAt(pUVar7,offset);
        tVar3 = charType(cVar1);
        this->type = tVar3;
      }
      this->type = tKeyword;
      iVar6 = offset;
      break;
    case tNotEqual:
      cVar1 = icu_63::UnicodeString::doCharAt(pUVar7,offset + 1);
      if (cVar1 == L'=') {
        iVar6 = offset + 2;
      }
      else {
        this->type = none;
        iVar6 = offset + 1;
      }
    }
    icu_63::UnicodeString::UnicodeString
              (&local_60,this->ruleSrc,this->ruleIndex,iVar6 - this->ruleIndex);
    icu_63::UnicodeString::moveFrom(&this->token,&local_60);
    icu_63::UnicodeString::~UnicodeString(&local_60);
    this->ruleIndex = iVar6;
  }
  else {
    this->type = tEOF;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }